

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getChangeLocations
          (RelationsAnalyzer *this,VRLocation *join,VectorSet<const_llvm::Value_*> *froms)

{
  bool bVar1;
  VRLocation *in_RDX;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *in_RDI;
  VectorSet<const_llvm::Value_*> *in_stack_00000038;
  VRLocation *in_stack_00000040;
  RelationsAnalyzer *in_stack_00000048;
  VectorSet<const_llvm::Value_*> *in_stack_00000068;
  VRLocation *in_stack_00000070;
  RelationsAnalyzer *in_stack_00000078;
  
  bVar1 = VRLocation::isJustLoopJoin(in_RDX);
  if ((!bVar1) && (bVar1 = VRLocation::isJustBranchJoin(in_RDX), !bVar1)) {
    memset(in_RDI,0,0x18);
    std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::vector
              ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
               0x1d0b83);
    return in_RDI;
  }
  bVar1 = VRLocation::isJustBranchJoin(in_RDX);
  if (bVar1) {
    getBranchChangeLocations(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  else {
    getLoopChangeLocations(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return in_RDI;
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getChangeLocations(const VRLocation &join,
                                      const VectorSet<V> &froms) {
    if (!join.isJustLoopJoin() && !join.isJustBranchJoin())
        return {};
    if (join.isJustBranchJoin()) {
        return getBranchChangeLocations(join, froms);
    }
    assert(join.isJustLoopJoin());
    return getLoopChangeLocations(join, froms);
}